

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O2

void __thiscall
Ptex::v2_2::PtexSeparableKernel::splitB(PtexSeparableKernel *this,PtexSeparableKernel *k)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  float *__src;
  float *__src_00;
  int iVar4;
  
  iVar1 = this->v;
  if (-iVar1 < this->vw) {
    uVar2 = *(undefined4 *)this;
    iVar4 = this->u;
    iVar3 = this->uw;
    __src = this->ku;
    __src_00 = this->kv;
    k->res = SUB42(uVar2,0);
    k->u = iVar4;
    k->v = (1 << ((byte)((uint)uVar2 >> 8) & 0x1f)) + iVar1;
    k->uw = iVar3;
    k->vw = -iVar1;
    memcpy(k->kubuff,__src,(long)iVar3 << 2);
    memcpy(k->kvbuff,__src_00,(long)iVar1 * -4);
    k->ku = k->kubuff;
    k->kv = k->kvbuff;
    k->rot = 0;
    iVar4 = iVar1 + this->vw;
    this->kv = this->kv + -(long)iVar1;
  }
  else {
    operator=(k,this);
    k->v = k->v + (1 << ((this->res).vlog2 & 0x1fU));
    iVar4 = 0;
  }
  this->v = 0;
  this->vw = iVar4;
  return;
}

Assistant:

void splitB(PtexSeparableKernel& k)
    {
        // split off bottom piece of width w into k
        int w = -v;
        if (w < vw) {
            // normal case - split off a portion
            //    res  u  v          uw vw  ku  kv
            k.set(res, u, res.v()-w, uw, w, ku, kv);

            // update local
            v = 0;
            vw -= w;
            kv += w;
        }
        else {
            // entire kernel is split off
            k = *this;
            k.v += res.v();
            v = 0; vw = 0;
        }
    }